

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

Qiniu_Error Qiniu_Client_Call(Qiniu_Client *self,Qiniu_Json **ret,char *url)

{
  CURL *curl_00;
  Qiniu_Error QVar1;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  undefined4 uStack_4c;
  CURL *curl;
  Qiniu_Header *headers;
  char *url_local;
  Qiniu_Json **ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  curl = (CURL *)0x0;
  headers = (Qiniu_Header *)url;
  url_local = (char *)ret;
  ret_local = (Qiniu_Json **)self;
  curl_00 = Qiniu_Client_initcall(self,url);
  QVar1 = Qiniu_Client_config((Qiniu_Client *)ret_local);
  err._0_8_ = QVar1.message;
  self_local = (Qiniu_Client *)CONCAT44(uStack_4c,QVar1.code);
  if (QVar1.code == 200) {
    if (ret_local[2] != (Qiniu_Json *)0x0) {
      QVar1 = Qiniu_Do_Auth((Qiniu_Client *)ret_local,"POST",(Qiniu_Header **)&curl,(char *)headers,
                            (char *)0x0,0);
      err._0_8_ = QVar1.message;
      self_local = (Qiniu_Client *)CONCAT44(uStack_5c,QVar1.code);
      if (QVar1.code != 200) goto LAB_00117b00;
    }
    curl_easy_setopt(curl_00,0x2727,curl);
    QVar1 = Qiniu_callex(curl_00,(Qiniu_Buffer *)(ret_local + 4),ret_local + 3,0,
                         (Qiniu_Buffer *)(ret_local + 7));
    err._0_8_ = QVar1.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_6c,QVar1.code);
    curl_slist_free_all(curl);
    *(Qiniu_Json **)url_local = ret_local[3];
  }
LAB_00117b00:
  QVar1._0_8_ = (ulong)self_local & 0xffffffff;
  QVar1.message = (char *)err._0_8_;
  return QVar1;
}

Assistant:

Qiniu_Error Qiniu_Client_Call(Qiniu_Client *self, Qiniu_Json **ret, const char *url)
{
    Qiniu_Error err;
    Qiniu_Header *headers = NULL;
    CURL *curl = Qiniu_Client_initcall(self, url);
    err = Qiniu_Client_config(self);
    if (err.code != 200)
    {
        return err;
    }

    if (self->auth.itbl != NULL)
    {
        err = Qiniu_Do_Auth(self, "POST", &headers, url, NULL, 0);
        if (err.code != 200)
        {
            return err;
        }
    }

    curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

    err = Qiniu_callex(curl, &self->b, &self->root, Qiniu_False, &self->respHeader);
    curl_slist_free_all(headers);
    *ret = self->root;
    return err;
}